

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallDirectoryGenerator.cxx
# Opt level: O2

string * __thiscall
cmInstallDirectoryGenerator::GetDestination
          (string *__return_storage_ptr__,cmInstallDirectoryGenerator *this,string *config)

{
  Snapshot snapshot;
  char *pcVar1;
  cmGeneratorExpression ge;
  allocator local_e1;
  undefined1 local_e0 [32];
  long local_c0;
  undefined1 local_b8 [64];
  cmGeneratorExpression local_78;
  Snapshot local_38;
  
  cmState::Snapshot::Snapshot(&local_38,(cmState *)0x0);
  local_e0._0_8_ = local_e0 + 0x10;
  local_e0._8_8_ = 0;
  local_e0[0x10] = '\0';
  local_c0 = 0;
  snapshot.Position.Tree = local_38.Position.Tree;
  snapshot.State = local_38.State;
  snapshot.Position.Position = local_38.Position.Position;
  cmListFileBacktrace::cmListFileBacktrace
            ((cmListFileBacktrace *)local_b8,snapshot,(cmCommandContext *)local_e0);
  cmGeneratorExpression::cmGeneratorExpression(&local_78,(cmListFileBacktrace *)local_b8);
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_b8);
  std::__cxx11::string::~string((string *)local_e0);
  cmGeneratorExpression::Parse((cmGeneratorExpression *)local_e0,(string *)&local_78);
  local_b8._0_8_ = (long)local_b8 + 0x10;
  local_b8._8_8_ = (cmLinkedTree<cmState::SnapshotDataType> *)0x0;
  local_b8[0x10] = '\0';
  pcVar1 = cmCompiledGeneratorExpression::Evaluate
                     ((cmCompiledGeneratorExpression *)local_e0._0_8_,this->LocalGenerator,config,
                      false,(cmGeneratorTarget *)0x0,(cmGeneratorTarget *)0x0,
                      (cmGeneratorExpressionDAGChecker *)0x0,(string *)local_b8);
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,&local_e1);
  std::__cxx11::string::~string((string *)local_b8);
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)local_e0);
  cmGeneratorExpression::~cmGeneratorExpression(&local_78);
  return __return_storage_ptr__;
}

Assistant:

std::string
cmInstallDirectoryGenerator::GetDestination(std::string const& config) const
{
  cmGeneratorExpression ge;
  return ge.Parse(this->Destination)
    ->Evaluate(this->LocalGenerator, config);
}